

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.hpp
# Opt level: O1

vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
* Tile<Color>::generate_action_map
            (vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *__return_storage_ptr__,Symmetry *symmetry)

{
  pointer pvVar1;
  undefined1 auVar2 [16];
  pointer puVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  long lVar8;
  size_type __n;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  vector<unsigned_int,_std::allocator<unsigned_int>_> rotation_map;
  vector<unsigned_int,_std::allocator<unsigned_int>_> reflection_map;
  allocator_type local_6a;
  allocator_type local_69;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_68;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_50;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_38;
  
  generate_rotation_map(&local_68,symmetry);
  generate_reflection_map(&local_38,symmetry);
  puVar3 = local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  __n = (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start >> 2;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector(&local_50,__n,&local_69);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::vector(__return_storage_ptr__,8,&local_50,&local_6a);
  if (local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_50.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  auVar2 = _DAT_00127060;
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    lVar4 = __n + (__n == 0);
    lVar7 = *(long *)&(((__return_storage_ptr__->
                        super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start)->
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                      super__Vector_impl_data;
    lVar5 = lVar4 + -1;
    auVar9._8_4_ = (int)lVar5;
    auVar9._0_8_ = lVar5;
    auVar9._12_4_ = (int)((ulong)lVar5 >> 0x20);
    uVar6 = 0;
    auVar9 = auVar9 ^ _DAT_00127060;
    auVar10 = _DAT_00127050;
    do {
      auVar11 = auVar10 ^ auVar2;
      if ((bool)(~(auVar11._4_4_ == auVar9._4_4_ && auVar9._0_4_ < auVar11._0_4_ ||
                  auVar9._4_4_ < auVar11._4_4_) & 1)) {
        *(int *)(lVar7 + uVar6 * 4) = (int)uVar6;
      }
      if ((auVar11._12_4_ != auVar9._12_4_ || auVar11._8_4_ <= auVar9._8_4_) &&
          auVar11._12_4_ <= auVar9._12_4_) {
        *(int *)(lVar7 + 4 + uVar6 * 4) = (int)uVar6 + 1;
      }
      uVar6 = uVar6 + 2;
      lVar5 = auVar10._8_8_;
      auVar10._0_8_ = auVar10._0_8_ + 2;
      auVar10._8_8_ = lVar5 + 2;
    } while ((lVar4 + 1U & 0xfffffffffffffffe) != uVar6);
  }
  pvVar1 = (__return_storage_ptr__->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar7 = 1;
  do {
    if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      lVar4 = *(long *)&pvVar1[lVar7 + -1].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data;
      lVar5 = *(long *)&pvVar1[lVar7].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data;
      lVar8 = 0;
      do {
        *(uint *)(lVar5 + lVar8 * 4) =
             local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[*(uint *)(lVar4 + lVar8 * 4)];
        lVar8 = lVar8 + 1;
      } while (__n + (__n == 0) != lVar8);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 4);
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish != puVar3) {
    pvVar1 = (__return_storage_ptr__->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar7 = *(long *)&(pvVar1->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data;
    lVar4 = *(long *)&pvVar1[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data;
    lVar5 = 0;
    do {
      *(uint *)(lVar4 + lVar5 * 4) =
           local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start[*(uint *)(lVar7 + lVar5 * 4)];
      lVar5 = lVar5 + 1;
    } while (__n + (__n == 0) != lVar5);
  }
  pvVar1 = (__return_storage_ptr__->
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  lVar7 = 5;
  do {
    if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish != puVar3) {
      lVar4 = *(long *)&pvVar1[lVar7 + -1].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data;
      lVar5 = *(long *)&pvVar1[lVar7].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data;
      lVar8 = 0;
      do {
        *(uint *)(lVar5 + lVar8 * 4) =
             local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start[*(uint *)(lVar4 + lVar8 * 4)];
        lVar8 = lVar8 + 1;
      } while (__n + (__n == 0) != lVar8);
    }
    lVar7 = lVar7 + 1;
  } while (lVar7 != 8);
  if (local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_38.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::vector<std::vector<unsigned>>
		generate_action_map(const Symmetry &symmetry) noexcept {
		std::vector<unsigned> rotation_map = generate_rotation_map(symmetry);
		std::vector<unsigned> reflection_map = generate_reflection_map(symmetry);
		size_t size = rotation_map.size();
		std::vector<std::vector<unsigned>> action_map(8,
			std::vector<unsigned>(size));
		for (size_t i = 0; i < size; ++i) {
			action_map[0][i] = i;
		}

		for (size_t a = 1; a < 4; ++a) {
			for (size_t i = 0; i < size; ++i) {
				action_map[a][i] = rotation_map[action_map[a - 1][i]];
			}
		}
		for (size_t i = 0; i < size; ++i) {
			action_map[4][i] = reflection_map[action_map[0][i]];
		}
		for (size_t a = 5; a < 8; ++a) {
			for (size_t i = 0; i < size; ++i) {
				action_map[a][i] = rotation_map[action_map[a - 1][i]];
			}
		}
		return action_map;
	}